

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t uVar1;
  pointer pUVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  uint32_t value;
  uint8_t *puVar5;
  UnknownFieldSet *unknown_fields_00;
  uint64_t uVar6;
  string *s;
  uint uVar7;
  uint uVar8;
  int i;
  long lVar9;
  byte *pbVar10;
  UnknownField *this;
  
  lVar9 = 0;
  do {
    pUVar2 = (unknown_fields->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(unknown_fields->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) >> 4) <=
        lVar9) {
      return target;
    }
    target = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (pUVar2[lVar9].type_ < 5) {
      this = pUVar2 + lVar9;
      switch(pUVar2[lVar9].type_) {
      case 0:
        uVar1 = this->number_;
        uVar6 = UnknownField::varint(this);
        target = WireFormatLite::WriteUInt64ToArray(uVar1,uVar6,target);
        break;
      case 1:
        uVar1 = this->number_;
        value = UnknownField::fixed32(this);
        target = WireFormatLite::WriteFixed32ToArray(uVar1,value,target);
        break;
      case 2:
        uVar1 = this->number_;
        uVar6 = UnknownField::fixed64(this);
        target = WireFormatLite::WriteFixed64ToArray(uVar1,uVar6,target);
        break;
      case 3:
        uVar1 = this->number_;
        s = UnknownField::length_delimited_abi_cxx11_(this);
        __n = s->_M_string_length;
        if ((long)__n < 0x80) {
          puVar5 = stream->end_;
          uVar7 = uVar1 * 8;
          iVar4 = io::EpsCopyOutputStream::TagSize(uVar7);
          if ((long)__n <= (long)(puVar5 + ~(ulong)(target + iVar4) + 0x10)) {
            *target = (byte)uVar7 | 2;
            if (uVar7 < 0x80) {
              pbVar10 = target + 1;
            }
            else {
              *target = (byte)uVar7 | 0x82;
              target[1] = (byte)(uVar7 >> 7);
              pbVar10 = target + 2;
              if (0x3fff < uVar7) {
                uVar8 = (uint)target[1];
                uVar7 = uVar7 >> 7;
                do {
                  pbVar10[-1] = (byte)uVar8 | 0x80;
                  uVar8 = uVar7 >> 7;
                  *pbVar10 = (byte)uVar8;
                  pbVar10 = pbVar10 + 1;
                  bVar3 = 0x3fff < uVar7;
                  uVar7 = uVar8;
                } while (bVar3);
              }
            }
            *pbVar10 = (byte)__n;
            memcpy(pbVar10 + 1,(s->_M_dataplus)._M_p,__n);
            target = pbVar10 + __n + 1;
            break;
          }
        }
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,uVar1,s,target);
        break;
      case 4:
        puVar5 = WireFormatLite::WriteTagToArray(this->number_,WIRETYPE_START_GROUP,target);
        unknown_fields_00 = UnknownField::group(this);
        puVar5 = InternalSerializeUnknownFieldsToArray(unknown_fields_00,puVar5,stream);
        puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar5);
        target = WireFormatLite::WriteTagToArray(this->number_,WIRETYPE_END_GROUP,puVar5);
      }
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    target = stream->EnsureSpace(target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        target = stream->EnsureSpace(target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}